

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflechannel.cpp
# Opt level: O0

int __thiscall
ncnn::ShuffleChannel::forward(ShuffleChannel *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  void *__dest;
  long in_RSI;
  long in_RDI;
  int dst_q;
  int src_q;
  int j;
  int i;
  size_t feature_sz;
  int chs_per_group;
  size_t elemsize;
  int c;
  int h;
  int w;
  Mat *in_stack_fffffffffffffef0;
  int _c;
  size_t in_stack_fffffffffffffef8;
  Mat *this_00;
  undefined8 in_stack_ffffffffffffff00;
  Mat *in_stack_ffffffffffffff10;
  Mat local_a0;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  size_t local_50;
  int local_44;
  long local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_40 = *(long *)(in_RSI + 0x10);
  local_44 = local_34 / *(int *)(in_RDI + 0xb8);
  if (local_34 == local_44 * *(int *)(in_RDI + 0xb8)) {
    Mat::create(in_stack_ffffffffffffff10,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),in_stack_fffffffffffffef8,
                (Allocator *)in_stack_fffffffffffffef0);
    bVar1 = Mat::empty(in_stack_fffffffffffffef0);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_50 = (local_2c * local_30) * local_40;
      for (local_54 = 0; local_54 != *(int *)(in_RDI + 0xb8); local_54 = local_54 + 1) {
        for (local_58 = 0; _c = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
            local_58 != local_44; local_58 = local_58 + 1) {
          local_5c = local_44 * local_54 + local_58;
          local_60 = *(int *)(in_RDI + 0xb8) * local_58 + local_54;
          this_00 = &local_a0;
          Mat::channel(this_00,_c);
          __dest = Mat::operator_cast_to_void_(this_00);
          Mat::channel(this_00,_c);
          in_stack_fffffffffffffef0 =
               (Mat *)Mat::operator_cast_to_void_((Mat *)&stack0xffffffffffffff10);
          memcpy(__dest,in_stack_fffffffffffffef0,local_50);
          Mat::~Mat((Mat *)0x1c1320);
          Mat::~Mat((Mat *)0x1c132a);
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = -100;
  }
  return local_4;
}

Assistant:

int ShuffleChannel::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int c = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int chs_per_group = c / group;

    if (c != chs_per_group * group)
    {
        // reject invalid group
        return -100;
    }

    top_blob.create(w, h, c, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const size_t feature_sz = w * h * elemsize;
    for (int i = 0; i != group; i++)
    {
        for (int j = 0; j != chs_per_group; j++)
        {
            int src_q = chs_per_group * i + j;
            int dst_q = group * j + i;
            memcpy(top_blob.channel(dst_q), bottom_blob.channel(src_q), feature_sz);
        }
    }
    return 0;
}